

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

void Curl_verboseconnect(Curl_easy *data,connectdata *conn,int sockindex)

{
  ConnectBits CVar1;
  uint uVar2;
  curl_trc_feat *pcVar3;
  long lVar4;
  char *fmt;
  
  uVar2 = (uint)*(undefined8 *)&(data->set).field_0x89c;
  if (sockindex == 1 && (uVar2 >> 0x1e & 1) != 0) {
    pcVar3 = (data->state).feat;
    if ((pcVar3 == (curl_trc_feat *)0x0) || (0 < pcVar3->log_level)) {
      Curl_infof(data,"Connected 2nd connection to %s port %u",&conn->secondary,
                 (ulong)(uint)(conn->secondary).remote_port);
    }
  }
  else if (((uVar2 >> 0x1e & 1) != 0) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) {
    CVar1 = conn->bits;
    lVar4 = 0x108;
    if ((((ulong)CVar1 & 2) == 0) &&
       ((lVar4 = 0x140, ((ulong)CVar1 & 1) == 0 && (lVar4 = 0xe8, (CVar1._0_4_ >> 8 & 1) == 0)))) {
      lVar4 = 0xb8;
    }
    Curl_infof(data,"Connected to %s (%s) port %u",
               *(undefined8 *)((long)&(conn->cpool_node)._list + lVar4),&conn->primary,
               (ulong)(uint)(conn->primary).remote_port);
  }
  if ((conn->handler->protocol & 0xc0000003) != 0) {
    uVar2 = (uint)*(undefined8 *)&(data->set).field_0x89c;
    if (conn->alpn == '\x03') {
      if ((uVar2 >> 0x1e & 1) == 0) {
        return;
      }
      pcVar3 = (data->state).feat;
      fmt = "using HTTP/2";
    }
    else if (conn->alpn == '\x1e') {
      if ((uVar2 >> 0x1e & 1) == 0) {
        return;
      }
      pcVar3 = (data->state).feat;
      fmt = "using HTTP/3";
    }
    else {
      if ((uVar2 >> 0x1e & 1) == 0) {
        return;
      }
      pcVar3 = (data->state).feat;
      fmt = "using HTTP/1.x";
    }
    if ((pcVar3 == (curl_trc_feat *)0x0) || (0 < pcVar3->log_level)) {
      Curl_infof(data,fmt);
      return;
    }
  }
  return;
}

Assistant:

void Curl_verboseconnect(struct Curl_easy *data,
                         struct connectdata *conn, int sockindex)
{
  if(data->set.verbose && sockindex == SECONDARYSOCKET)
    infof(data, "Connected 2nd connection to %s port %u",
          conn->secondary.remote_ip, conn->secondary.remote_port);
  else
    infof(data, "Connected to %s (%s) port %u",
          CURL_CONN_HOST_DISPNAME(conn), conn->primary.remote_ip,
          conn->primary.remote_port);
#ifndef CURL_DISABLE_HTTP
    if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
      switch(conn->alpn) {
      case CURL_HTTP_VERSION_3:
        infof(data, "using HTTP/3");
        break;
      case CURL_HTTP_VERSION_2:
        infof(data, "using HTTP/2");
        break;
      default:
        infof(data, "using HTTP/1.x");
        break;
      }
    }
#endif
}